

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalCreateARTIndex::GetGlobalSinkState
          (PhysicalCreateARTIndex *this,ClientContext *context)

{
  _Prime_rehash_policy *this_00;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> _Var2;
  DataTable *table;
  pointer pCVar3;
  pointer pCVar4;
  TableIOManager *args_3;
  pointer pCVar5;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> local_38;
  _Head_base<0UL,_duckdb::CreateARTIndexGlobalSinkState_*,_false> local_30;
  
  make_uniq<duckdb::CreateARTIndexGlobalSinkState>();
  table = (DataTable *)
          (*(code *)(*(context->config).profiler_settings._M_h._M_buckets)[0x10]._M_nxt)();
  this_00 = &(context->config).profiler_settings._M_h._M_rehash_policy;
  pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)this_00);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)this_00);
  args_3 = TableIOManager::Get(table);
  make_uniq<duckdb::ART,std::__cxx11::string&,duckdb::IndexConstraintType&,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>const&,duckdb::AttachedDatabase&>
            ((duckdb *)&local_38,&pCVar3->index_name,&pCVar4->constraint_type,
             (vector<unsigned_long,_true> *)
             &(context->config).profiler_settings._M_h._M_bucket_count,args_3,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&(context->config).profiler_settings._M_h._M_rehash_policy._M_next_resize,table->db)
  ;
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (BoundIndex *)0x0;
  pCVar5 = unique_ptr<duckdb::CreateARTIndexGlobalSinkState,_std::default_delete<duckdb::CreateARTIndexGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexGlobalSinkState,_std::default_delete<duckdb::CreateARTIndexGlobalSinkState>,_true>
                         *)&local_30);
  _Var1._M_head_impl =
       (pCVar5->global_index).
       super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
       super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl;
  (pCVar5->global_index).
  super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
  super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (BoundIndex *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_Index + 8))();
  }
  if (local_38._M_head_impl != (BoundIndex *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalCreateARTIndex::GetGlobalSinkState(ClientContext &context) const {
	// Create the global sink state.
	auto state = make_uniq<CreateARTIndexGlobalSinkState>();

	// Create the global index.
	auto &storage = table.GetStorage();
	state->global_index = make_uniq<ART>(info->index_name, info->constraint_type, storage_ids,
	                                     TableIOManager::Get(storage), unbound_expressions, storage.db);
	return (std::move(state));
}